

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O0

ErrorGenerator *
cmCMakePresetsErrors::INVALID_VARIABLE_OBJECT
          (ErrorGenerator *__return_storage_ptr__,ObjectError errorType,Members *extraFields)

{
  anon_class_1_0_00000001 local_61;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_Json::Value_*,_cmJSONState_*)>
  local_60;
  ObjectErrorGenerator local_40;
  Members *local_20;
  Members *extraFields_local;
  ErrorGenerator *pEStack_10;
  ObjectError errorType_local;
  
  local_20 = extraFields;
  extraFields_local._4_4_ = errorType;
  pEStack_10 = __return_storage_ptr__;
  std::function<std::__cxx11::string(Json::Value_const*,cmJSONState*)>::
  function<cmCMakePresetsErrors::INVALID_VARIABLE_OBJECT(JsonErrors::ObjectError,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0,void>
            ((function<std::__cxx11::string(Json::Value_const*,cmJSONState*)> *)&local_60,&local_61)
  ;
  JsonErrors::INVALID_NAMED_OBJECT(&local_40,&local_60);
  std::
  function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::operator()(__return_storage_ptr__,&local_40,extraFields_local._4_4_,local_20);
  std::
  function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::~function(&local_40);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_Json::Value_*,_cmJSONState_*)>
  ::~function(&local_60);
  return __return_storage_ptr__;
}

Assistant:

JsonErrors::ErrorGenerator INVALID_VARIABLE_OBJECT(
  JsonErrors::ObjectError errorType, const Json::Value::Members& extraFields)
{
  return JsonErrors::INVALID_NAMED_OBJECT(
    [](const Json::Value*, cmJSONState* state) -> std::string {
      return getVariableName(state);
    })(errorType, extraFields);
}